

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  bool bVar3;
  int local_24;
  int value;
  char *c_local;
  stbi__context *s_local;
  
  local_24 = 0;
  while( true ) {
    iVar2 = stbi__at_eof(s);
    bVar3 = false;
    if (iVar2 == 0) {
      iVar2 = stbi__pnm_isdigit(*c);
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    local_24 = local_24 * 10 + *c + -0x30;
    sVar1 = stbi__get8(s);
    *c = sVar1;
    if ((0xccccccc < local_24) || ((local_24 == 0xccccccc && ('7' < *c)))) {
      iVar2 = stbi__err("integer parse overflow");
      return iVar2;
    }
  }
  return local_24;
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
      if((value > 214748364) || (value == 214748364 && *c > '7'))
          return stbi__err("integer parse overflow", "Parsing an integer in the PPM header overflowed a 32-bit int");
   }

   return value;
}